

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O2

exp_double __thiscall
ising::square::transfer_matrix::product_D<std::vector<double,std::allocator<double>>>
          (transfer_matrix *this,double beta,vector<double,_std::allocator<double>_> *inter_x,
          vector<double,_std::allocator<double>_> *field,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  byte bVar2;
  int iVar3;
  pointer paVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  value_type extraout_XMM0_Qa;
  exp_double eVar14;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> weight;
  exp_number<double> local_40;
  
  uVar9 = (ulong)((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  standards::exp_number<double>::exp_number((exp_number<double> *)this,1.0);
  iVar8 = (int)uVar9;
  std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::vector
            (&weight,(long)iVar8,(allocator_type *)&local_40);
  lVar5 = 0;
  uVar10 = 0;
  if (0 < iVar8) {
    uVar10 = uVar9 & 0xffffffff;
  }
  for (; uVar10 * 8 != lVar5; lVar5 = lVar5 + 8) {
    dVar12 = ABS(*(double *)
                  ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar5) * beta);
    standards::exp_number<double>::exp_number(&local_40,dVar12);
    standards::exp_number<double>::operator*=((exp_number<double> *)this,&local_40);
    dVar13 = exp(*(double *)
                  ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar5) * beta - dVar12);
    *(double *)
     ((long)(weight.
             super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->elems + lVar5 * 2) = dVar13;
    dVar12 = exp(*(double *)
                  ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar5) * -beta - dVar12);
    *(double *)
     ((long)(weight.
             super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->elems + lVar5 * 2 + 8) = dVar12;
  }
  bVar2 = (byte)uVar9 & 0x1f;
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar6 = 0;
  uVar9 = (ulong)(uint)(1 << bVar2);
  if (1 << bVar2 < 1) {
    uVar9 = uVar6;
  }
  for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
    dVar12 = pdVar1[uVar6];
    paVar4 = weight.
             super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = uVar10;
    iVar3 = 0;
    while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
      dVar12 = dVar12 * paVar4->elems
                        [((uint)uVar6 >> ((byte)((iVar3 + 1) % iVar8) & 0x1f) ^
                         (uint)uVar6 >> ((byte)iVar3 & 0x1f)) & 1];
      paVar4 = paVar4 + 1;
      iVar3 = iVar3 + 1;
    }
    pdVar1[uVar6] = dVar12;
  }
  if ((field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    for (lVar5 = 0; uVar10 * 8 != lVar5; lVar5 = lVar5 + 8) {
      dVar12 = ABS(*(double *)
                    ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5) * beta);
      standards::exp_number<double>::exp_number(&local_40,dVar12);
      standards::exp_number<double>::operator*=((exp_number<double> *)this,&local_40);
      dVar13 = exp(*(double *)
                    ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5) * beta - dVar12);
      *(double *)
       ((long)(weight.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->elems + lVar5 * 2) = dVar13;
      dVar12 = exp(*(double *)
                    ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5) * -beta - dVar12);
      *(double *)
       ((long)(weight.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->elems + lVar5 * 2 + 8) = dVar12;
    }
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
      dVar12 = pdVar1[uVar6];
      paVar4 = weight.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
        dVar12 = dVar12 * paVar4->elems[((uint)uVar6 >> ((uint)uVar7 & 0x1f) & 1) != 0];
        paVar4 = paVar4 + 1;
      }
      pdVar1[uVar6] = dVar12;
    }
  }
  std::_Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::
  ~_Vector_base(&weight.
                 super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               );
  eVar14._8_8_ = this;
  eVar14.log_ = extraout_XMM0_Qa;
  return eVar14;
}

Assistant:

static exp_double product_D(double beta, std::vector<double> const& inter_x,
                                   std::vector<double> const& field, VEC& v) {
    int width = inter_x.size();
    int dim = 1 << width;
    exp_double normal = 1;
    std::vector<boost::array<double, 2> > weight(width);
    for (int b = 0; b < width; ++b) {
      double offset = std::abs(beta * inter_x[b]);
      normal *= standards::exp_number<double>(offset);
      weight[b][0] = std::exp(beta * inter_x[b] - offset);
      weight[b][1] = std::exp(-beta * inter_x[b] - offset);
    }
    for (int c = 0; c < dim; ++c) {
      double elem = v[c];
      for (int b = 0; b < width; ++b) {
        int s0 = b;
        int s1 = (b+1) % width;
        elem *= weight[b][((c >> s0) & 1) ^ ((c >> s1) & 1)];
      }
      v[c] = elem;
    }
    if (field.size()) {
      for (int s = 0; s < width; ++s) {
        double offset = std::abs(beta * field[s]);
        normal *= standards::exp_number<double>(offset);
        weight[s][0] = std::exp(beta * field[s] - offset);
        weight[s][1] = std::exp(-beta * field[s] - offset);
      }
      for (int c = 0; c < dim; ++c) {
        double elem = v[c];
        for (int s = 0; s < width; ++s) elem *= weight[s][((c >> s) & 1)];
        v[c] = elem;
      }
    }
    return normal;
  }